

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

uint32_t helper_usat16_aarch64(CPUARMState_conflict *env,uint32_t x,uint32_t shift)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = (uint)(short)x;
  uVar3 = ~(-1 << ((byte)shift & 0x1f));
  if ((short)x < 0) {
    uVar1 = 0;
LAB_0062f236:
    uVar2 = uVar1;
    env->QF = 1;
  }
  else {
    uVar1 = uVar3;
    if (uVar3 < uVar2) goto LAB_0062f236;
  }
  uVar1 = (int)x >> 0x10;
  if ((int)uVar1 < 0) {
    uVar3 = 0;
  }
  else if (uVar1 <= uVar3) goto LAB_0062f25b;
  env->QF = 1;
  uVar1 = uVar3;
LAB_0062f25b:
  return uVar1 << 0x10 | uVar2 & 0xffff;
}

Assistant:

uint32_t HELPER(usat16)(CPUARMState *env, uint32_t x, uint32_t shift)
{
    uint32_t res;

    res = (uint16_t)do_usat(env, (int16_t)x, shift);
    res |= do_usat(env, ((int32_t)x) >> 16, shift) << 16;
    return res;
}